

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O1

int xml_parse_data(ly_ctx *ctx,lyxml_elem *xml,lyd_node *parent,lyd_node *first_sibling,
                  lyd_node *prev,int options,unres_data *unres,lyd_node **result,
                  lyd_node **act_notif)

{
  ly_module_data_clb p_Var1;
  lys_node *node;
  lys_module *plVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  LY_VLOG_ELEM elem_type;
  LY_ECODE code;
  void *pvVar6;
  lyd_node *first_sibling_local;
  int editbits;
  lyd_attr *dattr;
  
  if (xml == (lyxml_elem *)0x0) {
    __assert_fail("xml",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_xml.c"
                  ,0x77,
                  "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **)"
                 );
  }
  if (result == (lyd_node **)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_xml.c"
                  ,0x78,
                  "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **)"
                 );
  }
  *result = (lyd_node *)0x0;
  if ((xml->flags & 1U) != 0) {
    if (((uint)options >> 9 & 1) == 0) {
      return 0;
    }
    pcVar4 = "XML element with mixed content";
    code = LYE_XML_INVAL;
    elem_type = LY_VLOG_XML;
    parent = (lyd_node *)xml;
    goto LAB_0013c06a;
  }
  if ((xml->ns == (lyxml_ns *)0x0) || (pcVar4 = xml->ns->value, pcVar4 == (char *)0x0)) {
    if (((uint)options >> 9 & 1) != 0) {
      ly_vlog(LYE_XML_MISS,LY_VLOG_XML,xml,"element\'s","namespace");
      return -1;
    }
    return 0;
  }
  if (parent == (lyd_node *)0x0) {
    plVar2 = ly_ctx_get_module_by_ns(ctx,pcVar4,(char *)0x0);
    if (ctx->data_clb != (ly_module_data_clb)0x0) {
      if (plVar2 == (lys_module *)0x0) {
        pcVar5 = xml->ns->value;
        pvVar6 = ctx->data_clb_data;
        pcVar4 = (char *)0x0;
        iVar3 = 0;
      }
      else {
        if ((char)plVar2->field_0x40 < '\0') goto LAB_0013bfe6;
        pcVar4 = plVar2->name;
        pcVar5 = plVar2->ns;
        pvVar6 = ctx->data_clb_data;
        iVar3 = 1;
      }
      (*ctx->data_clb)(ctx,pcVar4,pcVar5,iVar3,pvVar6);
    }
LAB_0013bfe6:
    node = (lys_node *)0x0;
  }
  else {
    node = xml_data_search_schemanode(xml,parent->schema->child,options);
    if (node == (lys_node *)0x0) goto LAB_0013bfe6;
    plVar2 = lys_node_module(node);
    if ((-1 < (char)plVar2->field_0x40) &&
       (p_Var1 = ctx->data_clb, p_Var1 != (ly_module_data_clb)0x0)) {
      plVar2 = lys_node_module(node);
      pcVar4 = plVar2->name;
      plVar2 = lys_node_module(node);
      (*p_Var1)(ctx,pcVar4,plVar2->ns,1,ctx->data_clb_data);
    }
  }
  lys_node_module(node);
  if (((uint)options >> 9 & 1) == 0) {
    return 0;
  }
  elem_type = (uint)(parent != (lyd_node *)0x0) * 3;
  pcVar4 = xml->name;
  code = LYE_INELEM;
LAB_0013c06a:
  ly_vlog(code,elem_type,parent,pcVar4);
  return -1;
}

Assistant:

static int
xml_parse_data(struct ly_ctx *ctx, struct lyxml_elem *xml, struct lyd_node *parent, struct lyd_node *first_sibling,
               struct lyd_node *prev, int options, struct unres_data *unres, struct lyd_node **result,
               struct lyd_node **act_notif)
{
    const struct lys_module *mod = NULL;
    struct lyd_node *diter, *dlast;
    struct lys_node *schema = NULL, *target;
    struct lys_node_augment *aug;
    struct lyd_attr *dattr, *dattr_iter;
    struct lyxml_attr *attr;
    struct lyxml_elem *child, *next;
    int i, j, havechildren, r, editbits = 0, pos, filterflag = 0, found;
    int ret = 0;
    const char *str = NULL;

    assert(xml);
    assert(result);
    *result = NULL;

    if (xml->flags & LYXML_ELEM_MIXED) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "XML element with mixed content");
            return -1;
        } else {
            return 0;
        }
    }

    if (!xml->ns || !xml->ns->value) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(LYE_XML_MISS, LY_VLOG_XML, xml, "element's", "namespace");
            return -1;
        } else {
            return 0;
        }
    }

    /* find schema node */
    if (!parent) {
        mod = ly_ctx_get_module_by_ns(ctx, xml->ns->value, NULL);
        if (ctx->data_clb) {
            if (!mod) {
                mod = ctx->data_clb(ctx, NULL, xml->ns->value, 0, ctx->data_clb_data);
            } else if (!mod->implemented) {
                mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }

        /* get the proper schema node */
        if (mod && mod->implemented && !mod->disabled) {
            schema = xml_data_search_schemanode(xml, mod->data, options);
            if (!schema) {
                /* it still can be the specific case of this module containing an augment of another module
                * top-level choice or top-level choice's case, bleh */
                for (j = 0; j < mod->augment_size; ++j) {
                    aug = &mod->augment[j];
                    target = aug->target;
                    if (target->nodetype & (LYS_CHOICE | LYS_CASE)) {
                        /* 1) okay, the target is choice or case */
                        while (target && (target->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES))) {
                            target = lys_parent(target);
                        }
                        /* 2) now, the data node will be top-level, there are only non-data schema nodes */
                        if (!target) {
                            while ((schema = (struct lys_node *)lys_getnext(schema, (struct lys_node *)aug, NULL, 0))) {
                                /* 3) alright, even the name matches, we found our schema node */
                                if (ly_strequal(schema->name, xml->name, 1)) {
                                    break;
                                }
                            }
                        }
                    }

                    if (schema) {
                        break;
                    }
                }
            }
        }
    } else {
        /* parsing some internal node, we start with parent's schema pointer */
        schema = xml_data_search_schemanode(xml, parent->schema->child, options);

        if (schema) {
            if (!lys_node_module(schema)->implemented && ctx->data_clb) {
                ctx->data_clb(ctx, lys_node_module(schema)->name, lys_node_module(schema)->ns,
                              LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }
    }

    mod = lys_node_module(schema);
    if (!mod || !mod->implemented || mod->disabled) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(LYE_INELEM, (parent ? LY_VLOG_LYD : LY_VLOG_NONE), parent, xml->name);
            return -1;
        } else {
            return 0;
        }
    }

    /* create the element structure */
    switch (schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
        *result = calloc(1, sizeof **result);
        havechildren = 1;
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        *result = calloc(1, sizeof(struct lyd_node_leaf_list));
        havechildren = 0;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        *result = calloc(1, sizeof(struct lyd_node_anydata));
        havechildren = 0;
        break;
    default:
        LOGINT;
        return -1;
    }
    if (!(*result)) {
        LOGMEM;
        return -1;
    }

    (*result)->prev = *result;
    (*result)->schema = schema;
    (*result)->parent = parent;
    diter = NULL;
    if (parent && parent->child && schema->nodetype == LYS_LEAF && parent->schema->nodetype == LYS_LIST &&
        (pos = lys_is_key((struct lys_node_list *)parent->schema, (struct lys_node_leaf *)schema))) {
        /* it is key and we need to insert it into a correct place */
        for (i = 0, diter = parent->child;
                diter && i < (pos - 1) && diter->schema->nodetype == LYS_LEAF &&
                    lys_is_key((struct lys_node_list *)parent->schema, (struct lys_node_leaf *)diter->schema);
                i++, diter = diter->next);
        if (diter) {
            /* out of order insertion - insert list's key to the correct position, before the diter */
            if (options & LYD_OPT_STRICT) {
                LOGVAL(LYE_INORDER, LY_VLOG_LYD, *result, schema->name, diter->schema->name);
                LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "Invalid position of the key \"%s\" in a list \"%s\".",
                       schema->name, parent->schema->name);
                free(*result);
                *result = NULL;
                return -1;
            } else {
                LOGWRN("Invalid position of the key \"%s\" in a list \"%s\".", schema->name, parent->schema->name)
            }
            if (parent->child == diter) {
                parent->child = *result;
                /* update first_sibling */
                first_sibling = *result;
            }
            if (diter->prev->next) {
                diter->prev->next = *result;
            }
            (*result)->prev = diter->prev;
            diter->prev = *result;
            (*result)->next = diter;
        }
    }
    if (!diter) {
        /* simplified (faster) insert as the last node */
        if (parent && !parent->child) {
            parent->child = *result;
        }
        if (prev) {
            (*result)->prev = prev;
            prev->next = *result;

            /* fix the "last" pointer */
            first_sibling->prev = *result;
        } else {
            (*result)->prev = *result;
            first_sibling = *result;
        }
    }
    (*result)->validity = ly_new_node_validity((*result)->schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        (*result)->when_status = LYD_WHEN;
    }

    /* process attributes */
    for (attr = xml->attr; attr; attr = attr->next) {
        if (attr->type != LYXML_ATTR_STD) {
            continue;
        } else if (!attr->ns) {
            if ((*result)->schema->nodetype == LYS_ANYXML &&
                    ly_strequal((*result)->schema->name, "filter", 0) &&
                    (ly_strequal((*result)->schema->module->name, "ietf-netconf", 0) ||
                    ly_strequal((*result)->schema->module->name, "notifications", 0))) {
                /* NETCONF filter's attributes, which we implement as non-standard annotations,
                 * they are unqualified (no namespace), but we know that we have internally defined
                 * them in the ietf-netconf module */
                str = "urn:ietf:params:xml:ns:netconf:base:1.0";
                filterflag = 1;
            } else {
                /* garbage */
                goto attr_error;
            }
        } else {
            str = attr->ns->value;
        }

        r = lyp_fill_attr(ctx, *result, str, NULL, attr->name, attr->value, xml, &dattr);
        if (r == -1) {
            goto error;
        } else if (r == 1) {
attr_error:
            if (options & LYD_OPT_STRICT) {
                LOGVAL(LYE_INMETA, LY_VLOG_LYD, *result, (attr->ns ? attr->ns->prefix : "<none>"), attr->name, attr->value);
                goto error;
            }

            LOGWRN("Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",
                   (attr->ns ? attr->ns->prefix : "<none>"), attr->name, attr->value);
            continue;
        }

        /* special case of xpath in the value, we want to convert it to JSON */
        if (filterflag && !strcmp(attr->name, "select")) {
            dattr->value.string = transform_xml2json(ctx, dattr->value_str, xml, 0, 1);
            if (!dattr->value.string) {
                /* problem with resolving value as xpath */
                dattr->value.string = dattr->value_str;
                goto error;
            }
            lydict_remove(ctx, dattr->value_str);
            dattr->value_str = dattr->value.string;
        }

        /* insert into the data node */
        if (!(*result)->attr) {
            (*result)->attr = dattr;
        } else {
            for (dattr_iter = (*result)->attr; dattr_iter->next; dattr_iter = dattr_iter->next);
            dattr_iter->next = dattr;
        }
        continue;
    }

    /* check insert attribute and its values */
    if (options & LYD_OPT_EDIT) {
        if (lyp_check_edit_attr(ctx, (*result)->attr, *result, &editbits)) {
            goto error;
        }

    /* check correct filter extension attributes */
    } else if (filterflag) {
        found = 0; /* 0 - nothing, 1 - type subtree, 2 - type xpath, 3 - select, 4 - type xpath + select */
        LY_TREE_FOR((*result)->attr, dattr_iter) {
            if (!strcmp(dattr_iter->name, "type")) {
                if ((found == 1) || (found == 2) || (found == 4)) {
                    LOGVAL(LYE_TOOMANY, LY_VLOG_LYD, (*result), "type", xml->name);
                    goto error;
                }
                switch (dattr_iter->value.enm->value) {
                case 0:
                    /* subtree */
                    if (found == 3) {
                        LOGVAL(LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                        goto error;
                    }

                    assert(!found);
                    found = 1;
                    break;
                case 1:
                    /* xpath */
                    if (found == 3) {
                        found = 4;
                    } else {
                        assert(!found);
                        found = 2;
                    }
                    break;
                default:
                    LOGINT;
                    goto error;
                }
            } else if (!strcmp(dattr_iter->name, "select")) {
                switch (found) {
                case 0:
                    found = 3;
                    break;
                case 1:
                    LOGVAL(LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                    goto error;
                case 2:
                    found = 4;
                    break;
                case 3:
                case 4:
                    LOGVAL(LYE_TOOMANY, LY_VLOG_LYD, (*result), "select", xml->name);
                    goto error;
                default:
                    LOGINT;
                    goto error;
                }
            }
        }

        /* check if what we found is correct */
        switch (found) {
        case 1:
        case 4:
            /* ok */
            break;
        case 2:
            LOGVAL(LYE_MISSATTR, LY_VLOG_LYD, (*result), "select", xml->name);
            goto error;
        case 3:
            LOGVAL(LYE_MISSATTR, LY_VLOG_LYD, (*result), "type", xml->name);
            goto error;
        default:
            LOGINT;
            goto error;
        }
    }

    /* type specific processing */
    if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* type detection and assigning the value */
        if (xml_get_value(*result, xml, editbits)) {
            goto error;
        }
    } else if (schema->nodetype & LYS_ANYDATA) {
        /* store children values */
        if (xml->child) {
            child = xml->child;
            /* manually unlink all siblings and correct namespaces */
            xml->child = NULL;
            LY_TREE_FOR(child, next) {
                next->parent = NULL;
                lyxml_correct_elem_ns(ctx, next, 1, 1);
            }

            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_XML;
            ((struct lyd_node_anydata *)*result)->value.xml = child;
        } else {
            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_CONSTSTRING;
            ((struct lyd_node_anydata *)*result)->value.str = lydict_insert(ctx, xml->content, 0);
        }
    } else if (schema->nodetype & (LYS_RPC | LYS_ACTION)) {
        if (!(options & LYD_OPT_RPC) || *act_notif) {
            LOGVAL(LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected %s node \"%s\".",
                   (schema->nodetype == LYS_RPC ? "rpc" : "action"), schema->name);
            goto error;
        }
        *act_notif = *result;
    } else if (schema->nodetype == LYS_NOTIF) {
        if (!(options & LYD_OPT_NOTIF) || *act_notif) {
            LOGVAL(LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected notification node \"%s\".", schema->name);
            goto error;
        }
        *act_notif = *result;
    }

    /* first part of validation checks */
    if (lyv_data_context(*result, options, unres)) {
        goto error;
    }

    /* process children */
    if (havechildren && xml->child) {
        diter = dlast = NULL;
        LY_TREE_FOR_SAFE(xml->child, next, child) {
            r = xml_parse_data(ctx, child, *result, (*result)->child, dlast, options, unres, &diter, act_notif);
            if (r) {
                goto error;
            } else if (options & LYD_OPT_DESTRUCT) {
                lyxml_free(ctx, child);
            }
            if (diter && !diter->next) {
                /* the child was parsed/created and it was placed as the last child. The child can be inserted
                 * out of order (not as the last one) in case it is a list's key present out of the correct order */
                dlast = diter;
            }
        }
    }

    /* if we have empty non-presence container, we keep it, but mark it as default */
    if (schema->nodetype == LYS_CONTAINER && !(*result)->child &&
            !(*result)->attr && !((struct lys_node_container *)schema)->presence) {
        (*result)->dflt = 1;
    }

    /* rest of validation checks */
    ly_err_clean(1);
    if (lyv_data_content(*result, options, unres) ||
             lyv_multicases(*result, NULL, prev ? &first_sibling : NULL, 0, NULL)) {
        if (ly_errno) {
            goto error;
        } else {
            goto clear;
        }
    }

    /* validation successful */
    if ((*result)->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
        /* postpone checking when there will be all list/leaflist instances */
        (*result)->validity |= LYD_VAL_UNIQUE;
    }

    return ret;

error:
    ret--;

clear:
    /* cleanup */
    for (i = unres->count - 1; i >= 0; i--) {
        /* remove unres items connected with the node being removed */
        if (unres->node[i] == *result) {
            unres_data_del(unres, i);
        }
    }
    lyd_free(*result);
    *result = NULL;

    return ret;
}